

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O0

uint8_t * quicly_encode_close_frame
                    (uint8_t *base,uint64_t error_code,uint64_t offending_frame_type,
                    char *reason_phrase)

{
  int iVar1;
  uint8_t *p;
  uint8_t *puVar2;
  long lVar3;
  size_t sVar4;
  char *in_RCX;
  uint64_t in_RDX;
  uint64_t in_RSI;
  long in_RDI;
  size_t reason_phrase_len;
  size_t offset;
  uint64_t in_stack_ffffffffffffffc8;
  size_t local_28;
  
  p = (uint8_t *)strlen(in_RCX);
  if (in_RDI == 0) {
    iVar1 = 0x1c;
    if (in_RDX == 0xffffffffffffffff) {
      iVar1 = 0x1d;
    }
    local_28 = quicly_encodev_capacity((long)iVar1);
  }
  else {
    puVar2 = ptls_encode_quicint(p,in_stack_ffffffffffffffc8);
    local_28 = (long)puVar2 - in_RDI;
  }
  if (in_RDI == 0) {
    sVar4 = quicly_encodev_capacity(in_RSI);
    local_28 = sVar4 + local_28;
  }
  else {
    puVar2 = ptls_encode_quicint(p,in_stack_ffffffffffffffc8);
    local_28 = (long)puVar2 - in_RDI;
  }
  if (in_RDX != 0xffffffffffffffff) {
    if (in_RDI == 0) {
      sVar4 = quicly_encodev_capacity(in_RDX);
      local_28 = sVar4 + local_28;
    }
    else {
      puVar2 = ptls_encode_quicint(p,in_stack_ffffffffffffffc8);
      local_28 = (long)puVar2 - in_RDI;
    }
  }
  if (in_RDI == 0) {
    sVar4 = quicly_encodev_capacity((uint64_t)p);
    lVar3 = sVar4 + local_28;
  }
  else {
    puVar2 = ptls_encode_quicint(p,in_stack_ffffffffffffffc8);
    lVar3 = (long)puVar2 - in_RDI;
    memcpy((void *)(in_RDI + lVar3),in_RCX,(size_t)p);
  }
  return p + in_RDI + lVar3;
}

Assistant:

uint8_t *quicly_encode_close_frame(uint8_t *const base, uint64_t error_code, uint64_t offending_frame_type,
                                   const char *reason_phrase)
{
    size_t offset = 0, reason_phrase_len = strlen(reason_phrase);

#define PUSHV(v)                                                                                                                   \
    do {                                                                                                                           \
        if (base != NULL) {                                                                                                        \
            offset = quicly_encodev(base + offset, (v)) - base;                                                                    \
        } else {                                                                                                                   \
            offset += quicly_encodev_capacity(v);                                                                                  \
        }                                                                                                                          \
    } while (0)

    PUSHV(offending_frame_type == UINT64_MAX ? QUICLY_FRAME_TYPE_APPLICATION_CLOSE : QUICLY_FRAME_TYPE_TRANSPORT_CLOSE);
    PUSHV(error_code);
    if (offending_frame_type != UINT64_MAX)
        PUSHV(offending_frame_type);
    PUSHV(reason_phrase_len);
    if (base != NULL)
        memcpy(base + offset, reason_phrase, reason_phrase_len);
    offset += reason_phrase_len;

#undef PUSHV

    return base + offset;
}